

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O2

void duckdb::ParquetDecodeUtils::CheckWidth(uint8_t width)

{
  InvalidInputException *this;
  allocator local_41;
  string local_40;
  
  if (width < 0x41) {
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "The width (%d) of the bitpacked data exceeds the supported max width (%d), the file might be corrupted."
             ,&local_41);
  InvalidInputException::InvalidInputException<unsigned_char,unsigned_long>
            (this,&local_40,width,0x41);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckWidth(const uint8_t width) {
		if (width >= BITPACK_MASKS_SIZE) {
			throw InvalidInputException("The width (%d) of the bitpacked data exceeds the supported max width (%d), "
			                            "the file might be corrupted.",
			                            width, BITPACK_MASKS_SIZE);
		}
	}